

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

void glfwSetCursor(GLFWwindow *windowHandle,GLFWcursor *cursorHandle)

{
  _GLFWcursor *cursor;
  _GLFWwindow *window;
  
  if (windowHandle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/glfw/src/input.c"
                  ,0x1cf,"void glfwSetCursor(GLFWwindow *, GLFWcursor *)");
  }
  if (_glfwInitialized != 0) {
    *(GLFWcursor **)(windowHandle + 0x48) = cursorHandle;
    _glfwPlatformSetCursor((_GLFWwindow *)windowHandle,(_GLFWcursor *)cursorHandle);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwSetCursor(GLFWwindow* windowHandle, GLFWcursor* cursorHandle)
{
    _GLFWwindow* window = (_GLFWwindow*) windowHandle;
    _GLFWcursor* cursor = (_GLFWcursor*) cursorHandle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    window->cursor = cursor;

    _glfwPlatformSetCursor(window, cursor);
}